

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O2

Expr * __thiscall SQCompilation::SQParser::Factor(SQParser *this,SQInteger *pos)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  ArrayExpr *this_00;
  ClassDecl *args;
  TableDecl *decl;
  Expr *pEVar6;
  long lVar7;
  byte bVar8;
  NestingChecker nc;
  int iVar5;
  
  NestingChecker::NestingChecker(&nc,this);
  lVar7 = this->_token;
  iVar4 = (int)(this->_lex)._tokenline;
  iVar5 = (int)(this->_lex)._tokencolumn;
  switch(lVar7) {
  case 0x11c:
    Lex(this);
    this_00 = (ArrayExpr *)UnaryOP(this,TO_CLONE);
    goto LAB_00155918;
  case 0x11d:
    bVar3 = false;
LAB_001557f3:
    this_00 = (ArrayExpr *)FunctionExp(this,bVar3);
    break;
  case 0x11e:
  case 0x120:
  case 0x121:
  case 0x122:
  case 0x123:
  case 0x124:
  case 0x125:
  case 0x126:
  case 0x127:
  case 0x128:
  case 0x129:
  case 300:
  case 0x12d:
  case 0x131:
  case 0x132:
  case 0x134:
  case 0x135:
  case 0x137:
  case 0x138:
switchD_00155247_caseD_11e:
    this_00 = (ArrayExpr *)0x0;
    reportDiagnostic(this,0x19,"expression");
    break;
  case 0x11f:
    Lex(this);
    this_00 = (ArrayExpr *)UnaryOP(this,TO_TYPEOF);
    goto LAB_00155918;
  case 0x12a:
    Lex(this);
    this_00 = (ArrayExpr *)UnaryOP(this,TO_RESUME);
    goto LAB_00155918;
  case 299:
    if ((this->_lang_features & 1) != 0) {
      reportDiagnostic(this,0x20);
    }
    this->_token = 0x2e;
    this_00 = (ArrayExpr *)newNode<SQCompilation::RootTableAccessExpr>(this);
    goto LAB_00155918;
  case 0x12e:
    this_00 = (ArrayExpr *)newNode<SQCompilation::Id,char_const*>(this,"this");
    (this_00->super_Expr).super_Node._coordinates.lineStart = iVar4;
    (this_00->super_Expr).super_Node._coordinates.columnStart = iVar5;
    (this_00->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
    (this_00->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
    Lex(this);
    break;
  case 0x12f:
  case 0x130:
    this_00 = (ArrayExpr *)PrefixIncDec(this,lVar7);
    goto LAB_00155918;
  case 0x133:
    Lex(this);
    args = ClassExp(this,(Expr *)0x0);
    this_00 = (ArrayExpr *)newNode<SQCompilation::DeclExpr,SQCompilation::Decl*>(this,(Decl *)args);
LAB_00155918:
    (this_00->super_Expr).super_Node._coordinates.lineStart = iVar4;
    (this_00->super_Expr).super_Node._coordinates.columnStart = iVar5;
    (this_00->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
LAB_0015593e:
    (this_00->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
    break;
  case 0x136:
    this_00 = (ArrayExpr *)newNode<SQCompilation::Id,char_const*>(this,"constructor");
    (this_00->super_Expr).super_Node._coordinates.lineStart = iVar4;
    (this_00->super_Expr).super_Node._coordinates.columnStart = iVar5;
    (this_00->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
    (this_00->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
    Lex(this);
    break;
  case 0x139:
    this_00 = (ArrayExpr *)newNode<SQCompilation::LiteralExpr,long>(this,(this->_lex)._currentline);
    (this_00->super_Expr).super_Node._coordinates.lineStart = iVar4;
    (this_00->super_Expr).super_Node._coordinates.columnStart = iVar5;
    (this_00->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
    (this_00->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
    Lex(this);
    break;
  case 0x13a:
    this_00 = (ArrayExpr *)newNode<SQCompilation::LiteralExpr,char_const*>(this,this->_sourcename);
    (this_00->super_Expr).super_Node._coordinates.lineStart = iVar4;
    (this_00->super_Expr).super_Node._coordinates.columnStart = iVar5;
    (this_00->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
    (this_00->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
    Lex(this);
    break;
  case 0x13b:
  case 0x13c:
    this_00 = (ArrayExpr *)newNode<SQCompilation::LiteralExpr,bool>(this,lVar7 == 0x13b);
    (this_00->super_Expr).super_Node._coordinates.lineStart = iVar4;
    (this_00->super_Expr).super_Node._coordinates.columnStart = iVar5;
    (this_00->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
    (this_00->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
    Lex(this);
    break;
  default:
    switch(lVar7) {
    case 0x102:
      this_00 = (ArrayExpr *)newId(this,(this->_lex)._svalue);
      (this_00->super_Expr).super_Node._coordinates.lineStart = iVar4;
      (this_00->super_Expr).super_Node._coordinates.columnStart = iVar5;
      Lex(this);
      break;
    case 0x103:
      this_00 = (ArrayExpr *)newStringLiteral(this,(this->_lex)._svalue);
      (this_00->super_Expr).super_Node._coordinates.lineStart = iVar4;
      (this_00->super_Expr).super_Node._coordinates.columnStart = iVar5;
      Lex(this);
      break;
    case 0x104:
      this_00 = (ArrayExpr *)newNode<SQCompilation::LiteralExpr,long>(this,(this->_lex)._nvalue);
      (this_00->super_Expr).super_Node._coordinates.lineStart = iVar4;
      (this_00->super_Expr).super_Node._coordinates.columnStart = iVar5;
      (this_00->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
      (this_00->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
      Lex(this);
      break;
    case 0x105:
      this_00 = (ArrayExpr *)newNode<SQCompilation::LiteralExpr,float>(this,(this->_lex)._fvalue);
      (this_00->super_Expr).super_Node._coordinates.lineStart = iVar4;
      (this_00->super_Expr).super_Node._coordinates.columnStart = iVar5;
      (this_00->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
      (this_00->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
      Lex(this);
      break;
    case 0x106:
      this_00 = (ArrayExpr *)newNode<SQCompilation::BaseExpr>(this);
      (this_00->super_Expr).super_Node._coordinates.lineStart = iVar4;
      (this_00->super_Expr).super_Node._coordinates.columnStart = iVar5;
      (this_00->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
      (this_00->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
      Lex(this);
      break;
    case 0x107:
      if ((this->_lang_features & 4) != 0) {
        reportDiagnostic(this,0x21);
      }
      this_00 = (ArrayExpr *)DeleteExpr(this);
      break;
    default:
      if (lVar7 == 0x21) {
        Lex(this);
        this_00 = (ArrayExpr *)UnaryOP(this,TO_NOT);
        goto LAB_00155918;
      }
      if (lVar7 == 0x28) {
        Lex(this);
        pEVar6 = Expression(this,this->_expression_context);
        this_00 = (ArrayExpr *)
                  newNode<SQCompilation::UnExpr,TreeOp,SQCompilation::Expr*>(this,TO_PAREN,pEVar6);
        (this_00->super_Expr).super_Node._coordinates.lineStart = iVar4;
        (this_00->super_Expr).super_Node._coordinates.columnStart = iVar5;
        (this_00->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
        (this_00->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
        Expect(this,0x29);
        break;
      }
      if (lVar7 == 0x2d) {
        Lex(this);
        if (this->_token == 0x105) {
          this_00 = (ArrayExpr *)
                    newNode<SQCompilation::LiteralExpr,float>(this,-(this->_lex)._fvalue);
          (this_00->super_Expr).super_Node._coordinates.lineStart = iVar4;
          (this_00->super_Expr).super_Node._coordinates.columnStart = iVar5;
          (this_00->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
          (this_00->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn
          ;
          Lex(this);
          break;
        }
        if (this->_token == 0x104) {
          this_00 = (ArrayExpr *)
                    newNode<SQCompilation::LiteralExpr,long>(this,-(this->_lex)._nvalue);
          (this_00->super_Expr).super_Node._coordinates.lineStart = iVar4;
          (this_00->super_Expr).super_Node._coordinates.columnStart = iVar5;
          (this_00->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
          (this_00->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn
          ;
          Lex(this);
          break;
        }
        this_00 = (ArrayExpr *)UnaryOP(this,TO_NEG);
        goto LAB_00155918;
      }
      if (lVar7 == 0x40) {
        bVar3 = true;
        goto LAB_001557f3;
      }
      if (lVar7 == 0x5b) {
        Lex(this);
        this_00 = newNode<SQCompilation::ArrayExpr,Arena*>(this,this->_astArena);
        bVar3 = false;
        bVar1 = 0;
        bVar8 = 0;
        while (this->_token != 0x5d) {
          pEVar6 = Expression(this,SQE_ARRAY_ELEM);
          ArrayExpr::addValue(this_00,pEVar6);
          lVar7 = this->_token;
          if (lVar7 == 0x2c) {
LAB_001557a8:
            bVar3 = true;
            if (!(bool)(~bVar1 & 1 | bVar8)) {
              reportDiagnostic(this,0x6d,"elements of array");
              lVar7 = this->_token;
              bVar3 = true;
              bVar8 = 1;
            }
          }
          else {
            bVar2 = 1;
            if (lVar7 == 0x5d) {
              bVar2 = bVar1;
            }
            bVar1 = bVar2;
            if (bVar3) goto LAB_001557a8;
            bVar3 = false;
          }
          if (lVar7 == 0x2c) {
            Lex(this);
          }
        }
        (this_00->super_Expr).super_Node._coordinates.lineStart = iVar4;
        (this_00->super_Expr).super_Node._coordinates.columnStart = iVar5;
        (this_00->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
        (this_00->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
        Lex(this);
        break;
      }
      if (lVar7 != 0x7b) {
        if (lVar7 != 0x7e) {
          if (lVar7 == 0x116) {
            this_00 = (ArrayExpr *)newNode<SQCompilation::LiteralExpr>(this);
            (this_00->super_Expr).super_Node._coordinates.lineStart = iVar4;
            (this_00->super_Expr).super_Node._coordinates.columnStart = iVar5;
            (this_00->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
            (this_00->super_Expr).super_Node._coordinates.columnEnd =
                 (int)(this->_lex)._currentcolumn;
            Lex(this);
            break;
          }
          if (lVar7 == 0x154) {
            this_00 = (ArrayExpr *)parseStringTemplate(this);
            break;
          }
          goto switchD_00155247_caseD_11e;
        }
        Lex(this);
        if (this->_token == 0x104) {
          this_00 = (ArrayExpr *)
                    newNode<SQCompilation::LiteralExpr,long>(this,~(this->_lex)._nvalue);
          (this_00->super_Expr).super_Node._coordinates.lineStart = iVar4;
          (this_00->super_Expr).super_Node._coordinates.columnStart = iVar5;
          (this_00->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
          (this_00->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn
          ;
          Lex(this);
          break;
        }
        this_00 = (ArrayExpr *)UnaryOP(this,TO_BNOT);
        goto LAB_00155918;
      }
      Lex(this);
      decl = newNode<SQCompilation::TableDecl,Arena*>(this,this->_astArena);
      ParseTableOrClass(this,decl,0x2c,0x7d);
      (decl->super_Decl).super_Statement.super_Node._coordinates.lineStart = iVar4;
      (decl->super_Decl).super_Statement.super_Node._coordinates.columnStart = iVar5;
      (decl->super_Decl).super_Statement.super_Node._coordinates.lineEnd =
           (int)(this->_lex)._currentline;
      (decl->super_Decl).super_Statement.super_Node._coordinates.columnEnd =
           (int)(this->_lex)._currentcolumn;
      this_00 = (ArrayExpr *)newNode<SQCompilation::DeclExpr,SQCompilation::TableDecl*>(this,decl);
      (this_00->super_Expr).super_Node._coordinates.lineStart = iVar4;
      (this_00->super_Expr).super_Node._coordinates.columnStart = iVar5;
      (this_00->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
      goto LAB_0015593e;
    }
  }
  (nc._p)->_depth = (nc._p)->_depth - nc._depth;
  return &this_00->super_Expr;
}

Assistant:

Expr* SQParser::Factor(SQInteger &pos)
{
    NestingChecker nc(this);
    Expr *r = NULL;

    SQInteger l = line(), c = column();

    switch(_token)
    {
    case TK_STRING_LITERAL:
        r = newStringLiteral(_lex._svalue);
        r->setLineStartPos(l); r->setColumnStartPos(c);
        Lex();
        break;
    case TK_TEMPLATE_OP:
        r = parseStringTemplate();
        break;
    case TK_BASE:
        r = setCoordinates(newNode<BaseExpr>(), l, c);
        Lex();
        break;
    case TK_IDENTIFIER:
        r = newId(_lex._svalue);
        r->setLineStartPos(l); r->setColumnStartPos(c);
        Lex();
        break;
    case TK_CONSTRUCTOR:
        r = setCoordinates(newNode<Id>(_SC("constructor")), l, c);
        Lex();
        break;
    case TK_THIS: r = setCoordinates(newNode<Id>(_SC("this")), l, c); Lex(); break;
    case TK_DOUBLE_COLON:  // "::"
        if (_lang_features & LF_FORBID_ROOT_TABLE)
            reportDiagnostic(DiagnosticsId::DI_ROOT_TABLE_FORBIDDEN);
        _token = _SC('.'); /* hack: drop into PrefixExpr, case '.'*/
        r = setCoordinates(newNode<RootTableAccessExpr>(), l, c);
        break;
    case TK_NULL:
        r = setCoordinates(newNode<LiteralExpr>(), l, c);
        Lex();
        break;
    case TK_INTEGER:
        r = setCoordinates(newNode<LiteralExpr>(_lex._nvalue), l, c);
        Lex();
        break;
    case TK_FLOAT:
        r = setCoordinates(newNode<LiteralExpr>(_lex._fvalue), l, c);
        Lex();
        break;
    case TK_TRUE: case TK_FALSE:
        r = setCoordinates(newNode<LiteralExpr>((bool)(_token == TK_TRUE)), l, c);
        Lex();
        break;
    case _SC('['): {
            Lex();
            ArrayExpr *arr = newNode<ArrayExpr>(arena());
            bool commaSeparated = false;
            bool spaceSeparated = false;
            bool reported = false;
            while(_token != _SC(']')) {
                Expr *v = Expression(SQE_ARRAY_ELEM);
                arr->addValue(v);
                if (_token == _SC(',')) {
                    commaSeparated = true;
                }
                else if (_token != _SC(']')) {
                    spaceSeparated = true;
                }

                if (commaSeparated && spaceSeparated && !reported) {
                    reported = true; // do not spam in output, a single diag seems to be enough
                    reportDiagnostic(DiagnosticsId::DI_MIXED_SEPARATORS, "elements of array");
                }

                if (_token == _SC(',')) {
                    Lex();
                }
            }
            setCoordinates(arr, l, c);
            Lex();
            r = arr;
        }
        break;
    case _SC('{'): {
        Lex();
        TableDecl *t = newNode<TableDecl>(arena());
        ParseTableOrClass(t, _SC(','), _SC('}'));
        setCoordinates(t, l, c);
        r = setCoordinates(newNode<DeclExpr>(t), l, c);
        break;
    }
    case TK_FUNCTION:
        r = FunctionExp(false);
        break;
    case _SC('@'):
        r = FunctionExp(true);
        break;
    case TK_CLASS: {
        Lex();
        Decl *classDecl = ClassExp(NULL);
        r = setCoordinates(newNode<DeclExpr>(classDecl), l, c);
        break;
    }
    case _SC('-'):
        Lex();
        switch(_token) {
        case TK_INTEGER:
            r = setCoordinates(newNode<LiteralExpr>(-_lex._nvalue), l, c);
            Lex();
            break;
        case TK_FLOAT:
            r = setCoordinates(newNode<LiteralExpr>(-_lex._fvalue), l, c);
            Lex();
            break;
        default:
            r = setCoordinates(UnaryOP(TO_NEG), l, c);
            break;
        }
        break;
    case _SC('!'):
        Lex();
        r = setCoordinates(UnaryOP(TO_NOT), l, c);
        break;
    case _SC('~'):
        Lex();
        if(_token == TK_INTEGER)  {
            r = setCoordinates(newNode<LiteralExpr>(~_lex._nvalue), l, c);
            Lex();
        }
        else {
            r = setCoordinates(UnaryOP(TO_BNOT), l, c);
        }
        break;
    case TK_TYPEOF : Lex(); r = setCoordinates(UnaryOP(TO_TYPEOF), l, c); break;
    case TK_RESUME : Lex(); r = setCoordinates(UnaryOP(TO_RESUME), l, c); break;
    case TK_CLONE : Lex(); r = setCoordinates(UnaryOP(TO_CLONE), l, c); break;
    case TK_MINUSMINUS :
    case TK_PLUSPLUS :
        r = setCoordinates(PrefixIncDec(_token), l, c);
        break;
    case TK_DELETE :
        if (_lang_features & LF_FORBID_DELETE_OP) {
            reportDiagnostic(DiagnosticsId::DI_DELETE_OP_FORBIDDEN);
        }
        r = DeleteExpr();
        break;
    case _SC('('):
        Lex();
        r = setCoordinates(newNode<UnExpr>(TO_PAREN, Expression(_expression_context)), l, c);
        Expect(_SC(')'));
        break;
    case TK___LINE__:
        r = setCoordinates(newNode<LiteralExpr>(_lex._currentline), l, c);
        Lex();
        break;
    case TK___FILE__:
        r = setCoordinates(newNode<LiteralExpr>(_sourcename), l, c);
        Lex();
        break;
    default:
        reportDiagnostic(DiagnosticsId::DI_EXPECTED_TOKEN, "expression");
    }
    return r;
}